

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int __fd;
  int iVar6;
  char *extraout_RAX;
  size_t sVar7;
  char *pcVar8;
  FILE *__stream;
  char *pcVar9;
  FILE *pFVar10;
  __off_t _Var11;
  ssize_t sVar12;
  uint uVar13;
  uint uVar14;
  long *unaff_RBX;
  long lVar15;
  uint unaff_EBP;
  char *pcVar16;
  long unaff_R12;
  long lVar17;
  libdir *plVar18;
  uint unaff_R13D;
  size_t sVar19;
  long lVar20;
  char **unaff_R14;
  ulong uVar21;
  ulong uVar22;
  library lib;
  char buf [8192];
  int local_3fc0;
  int local_3fb4;
  long local_3fb0;
  long local_3fa8;
  library local_3f78 [142];
  char local_2039 [8201];
  
  if (0 < argc) {
    pcVar16 = *argv;
    if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
      progname = pcVar16;
    }
    unaff_R14 = argv;
    unaff_R13D = argc;
    if (argc == 1) goto LAB_0010249b;
    unaff_EBP = 2;
    unaff_RBX = (long *)0x20;
    lVar15 = 0;
    unaff_R12 = 0;
    local_3fb4 = 0;
    local_3fc0 = 0;
LAB_00102321:
    bVar1 = argv[1][lVar15];
    uVar13 = (uint)unaff_RBX;
    uVar14 = uVar13;
    local_3fa8._0_4_ = argc;
    if (bVar1 < 0x66) {
      if (bVar1 < 0x43) {
        if (bVar1 == 0x2d) goto LAB_001023c4;
        if (bVar1 != 0) {
          if (bVar1 == 0x3f) {
LAB_0010247c:
            pcVar16 = "";
            unaff_RBX = (long *)(verbose_help_long_help + 8);
            do {
              puts(pcVar16);
              pcVar16 = (char *)*unaff_RBX;
              unaff_RBX = unaff_RBX + 1;
            } while (pcVar16 != (char *)0x0);
          }
          goto LAB_0010249b;
        }
        goto LAB_0010244a;
      }
      if (bVar1 == 0x43) {
        if (argc == unaff_EBP) goto LAB_0010249b;
        iVar4 = chdir(argv[(int)unaff_EBP]);
        if (iVar4 == 0) {
          unaff_EBP = unaff_EBP + 1;
          goto LAB_001023c4;
        }
        pFVar10 = (FILE *)argv[(int)unaff_EBP];
        pcVar16 = "Can\'t chdir to %s\n";
        goto LAB_0010269c;
      }
      if (bVar1 != 0x49) {
        if (bVar1 == 99) goto LAB_0010237e;
        goto LAB_0010249b;
      }
      if (argc == unaff_EBP) goto LAB_0010249b;
      lVar17 = (long)(int)unaff_EBP;
      unaff_EBP = unaff_EBP + 1;
      list_file = argv[lVar17];
      if (local_3fc0 != 0) {
        puts("Warning: multiple I options.  Previous ignored.");
      }
      local_3fc0 = 1;
LAB_001023c4:
      lVar15 = lVar15 + 1;
      unaff_RBX = (long *)(ulong)uVar14;
      goto LAB_00102321;
    }
    if (0x75 < bVar1) {
      if (bVar1 != 0x76) {
        if (bVar1 == 0x78) goto LAB_0010237e;
        goto LAB_0010249b;
      }
      local_3fb4 = 1;
      goto LAB_001023c4;
    }
    if (bVar1 == 0x66) {
      if (argc == unaff_EBP) goto LAB_0010249b;
      lVar17 = (long)(int)unaff_EBP;
      unaff_EBP = unaff_EBP + 1;
      library_file = argv[lVar17];
      if ((int)unaff_R12 != 0) {
        puts("Warning: multiple f options.  Previous ignored.");
      }
      unaff_R12 = 1;
      goto LAB_001023c4;
    }
    if (bVar1 != 0x74) {
      if (bVar1 == 0x68) goto LAB_0010247c;
      goto LAB_0010249b;
    }
LAB_0010237e:
    uVar14 = (uint)bVar1;
    if ((char)unaff_RBX == ' ') goto LAB_001023c4;
    puts("Only one of t,x,c may be specified.");
    usage();
LAB_0010244a:
    unaff_R12 = (long)(int)unaff_EBP;
    pcVar16 = argv[unaff_R12];
    if (local_3fc0 == 0 || pcVar16 == (char *)0x0) goto LAB_001024a0;
    pcVar16 = "Too many arguments.";
    goto LAB_0010246d;
  }
LAB_0010249b:
  uVar13 = (uint)unaff_RBX;
  usage();
  pcVar16 = extraout_RAX;
  argv = unaff_R14;
  argc = unaff_R13D;
LAB_001024a0:
  if ((char)uVar13 == 'c') {
    uVar14 = argc - unaff_EBP;
    uVar22 = 0;
    if ((uVar14 != 0 && (int)unaff_EBP <= argc) && pcVar16 != (char *)0x0) {
      lVar15 = 0;
      do {
        if (lVar15 == 2000) goto LAB_001028a0;
        pcVar16 = *(char **)((long)argv + lVar15 + unaff_R12 * 8);
        sVar7 = strlen(pcVar16);
        pcVar8 = (char *)malloc(sVar7 + 1);
        *(char **)((long)&local_3f78[0].fdata + lVar15 * 4) = pcVar8;
        strcpy(pcVar8,pcVar16);
        lVar15 = lVar15 + 8;
      } while ((ulong)uVar14 * 8 - lVar15 != 0);
      uVar22 = (ulong)uVar14;
    }
    if (local_3fc0 == 0) {
LAB_00102890:
      iVar4 = (int)uVar22;
      if (iVar4 == 0) {
        pcVar16 = "No files to archive";
        goto LAB_0010246d;
      }
      if (iVar4 < 1) {
        lVar15 = 0;
        lVar17 = 0;
      }
      else {
        lVar20 = 0;
        lVar17 = 0;
        lVar15 = 0;
        do {
          pFVar10 = *(FILE **)((long)&local_3f78[0].fdata + lVar20);
          iVar5 = open((char *)pFVar10,0,0);
          if (iVar5 < 0) {
            pcVar16 = "Can\'t open %s\n";
            goto LAB_0010269c;
          }
          _Var11 = lseek(iVar5,0,2);
          *(__off_t *)((long)&local_3f78[0].dir + lVar20) = _Var11;
          *(long *)((long)&local_3f78[0].fmark + lVar20) = lVar17;
          sVar7 = strlen((char *)pFVar10);
          lVar15 = lVar15 + sVar7;
          lVar17 = lVar17 + _Var11;
          close(iVar5);
          lVar20 = lVar20 + 0x20;
        } while (uVar22 << 5 != lVar20);
      }
      iVar5 = open(library_file,0x242,0x1b0);
      if (-1 < iVar5) {
        lVar20 = (long)(iVar4 * 0xb) + 0x3c + lVar15;
        write_dlb_directory(iVar5,iVar4,(libdir *)local_3f78,lVar15,lVar20,lVar17);
        if (0 < iVar4) {
          bVar2 = false;
          uVar21 = 0;
          local_3fa8 = 0;
          do {
            pFVar10 = (&local_3f78[0].fdata)[uVar21 * 4];
            __fd = open((char *)pFVar10,0,0);
            if (__fd < 0) {
              pcVar16 = "Can\'t open input file \'%s\'\n";
              goto LAB_0010269c;
            }
            if (local_3fb4 != 0) {
              puts((char *)pFVar10);
            }
            plVar18 = (libdir *)0x0;
            while( true ) {
              sVar12 = read(__fd,local_2039 + 1,0x2000);
              iVar6 = (int)sVar12;
              if (iVar6 == 0) break;
              if (iVar6 == -1) {
                pcVar16 = "Read Error in \'%s\'\n";
                goto LAB_0010269c;
              }
              sVar19 = (size_t)iVar6;
              sVar7 = write(iVar5,local_2039 + 1,sVar19);
              plVar18 = (libdir *)((long)&plVar18->fname + sVar19);
              if (sVar7 != sVar19) {
                pcVar16 = "Write Error in \'%s\'\n";
                goto LAB_0010269c;
              }
            }
            close(__fd);
            if (plVar18 != (&local_3f78[0].dir)[uVar21 * 4]) {
              bVar2 = true;
            }
            (&local_3f78[0].dir)[uVar21 * 4] = plVar18;
            (&local_3f78[0].fmark)[uVar21 * 4] = local_3fa8;
            local_3fa8 = (long)&plVar18->fname + local_3fa8;
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar22);
          if (bVar2) {
            if (local_3fb4 != 0) {
              puts("(rewriting dlb directory info)");
            }
            lseek(iVar5,0,0);
            write_dlb_directory(iVar5,iVar4,(libdir *)local_3f78,lVar15,lVar20,local_3fa8);
          }
          if (0 < iVar4) {
            lVar15 = 0;
            do {
              free(*(void **)((long)&local_3f78[0].fdata + lVar15));
              *(undefined8 *)((long)&local_3f78[0].fdata + lVar15) = 0;
              lVar15 = lVar15 + 0x20;
            } while (uVar22 << 5 != lVar15);
          }
        }
        close(iVar5);
LAB_001027f6:
        exit(0);
      }
      pcVar16 = "Can\'t open %s for output\n";
      pFVar10 = (FILE *)library_file;
    }
    else {
      __stream = fopen(list_file,"r");
      if (__stream != (FILE *)0x0) {
        pcVar16 = local_2039 + 1;
        pcVar8 = fgets(pcVar16,0x2000,__stream);
        if (pcVar8 != (char *)0x0) {
          uVar21 = 0xfa;
          if (0xfa < (uint)uVar22) {
            uVar21 = uVar22;
          }
          do {
            pcVar8 = pcVar16;
            if (uVar22 == uVar21) goto LAB_001028a0;
            do {
              pcVar9 = pcVar8;
              pcVar8 = pcVar9 + 1;
            } while (*pcVar9 != '\0');
            pcVar9[-1] = '\0';
            sVar7 = strlen(pcVar16);
            pFVar10 = (FILE *)malloc(sVar7 + 1);
            (&local_3f78[0].fdata)[uVar22 * 4] = pFVar10;
            strcpy((char *)pFVar10,pcVar16);
            uVar22 = uVar22 + 1;
            pcVar8 = fgets(pcVar16,0x2000,__stream);
          } while (pcVar8 != (char *)0x0);
          uVar22 = uVar22 & 0xffffffff;
        }
        fclose(__stream);
        goto LAB_00102890;
      }
      pcVar16 = "Can\'t open %s\n";
      pFVar10 = (FILE *)list_file;
    }
LAB_0010269c:
    printf(pcVar16,pFVar10);
  }
  else {
    if ((uVar13 & 0xff) == 0x74) {
      bVar3 = open_library(library_file,local_3f78);
      if (bVar3 != '\0') {
        if (0 < local_3f78[0].nentries) {
          lVar15 = 0x10;
          lVar17 = 0;
          do {
            pcVar16 = *(char **)((long)local_3f78[0].dir + lVar15 + -0x10);
            if (local_3fb4 == 0) {
              puts(pcVar16);
            }
            else {
              printf("%-14s %6ld %6ld\n",pcVar16,
                     *(undefined8 *)((long)local_3f78[0].dir + lVar15 + -8),
                     *(undefined8 *)((long)&(local_3f78[0].dir)->fname + lVar15));
            }
            lVar17 = lVar17 + 1;
            lVar15 = lVar15 + 0x20;
          } while (lVar17 < local_3f78[0].nentries);
        }
        if (local_3fb4 != 0) {
          printf("Revision:%ld  File count:%ld  String size:%ld\n",local_3f78[0].rev,
                 local_3f78[0].nentries,local_3f78[0].strsize);
        }
        goto LAB_001027ec;
      }
LAB_0010275b:
      pcVar16 = "Can\'t open dlb file";
    }
    else {
      if ((uVar13 & 0xff) == 0x78) {
        bVar3 = open_library(library_file,local_3f78);
        if (bVar3 == '\0') goto LAB_0010275b;
        if (0 < local_3f78[0].nentries) {
          uVar22 = (ulong)(uint)argc;
          local_3fb0 = 0;
          do {
            plVar18 = local_3f78[0].dir;
            if (argv[unaff_R12] == (char *)0x0) {
              iVar4 = strcmp(local_3f78[0].dir[local_3fb0].fname,"Directory");
              if (iVar4 != 0) {
LAB_0010258b:
                fseek((FILE *)local_3f78[0].fdata,plVar18[local_3fb0].foffset,0);
                iVar4 = open(local_3f78[0].dir[local_3fb0].fname,0x241,0x1a0);
                if (iVar4 < 0) {
                  pcVar16 = "Can\'t create \'%s\'\n";
                  pFVar10 = (FILE *)local_3f78[0].dir[local_3fb0].fname;
                  goto LAB_0010269c;
                }
                lVar15 = local_3f78[0].dir[local_3fb0].fsize;
                lVar17 = 0;
                do {
                  lVar15 = lVar15 - lVar17;
                  if (0x1fff < lVar15) {
                    lVar15 = 0x2000;
                  }
                  sVar7 = fread(local_2039 + 1,1,(long)(int)lVar15,(FILE *)local_3f78[0].fdata);
                  if ((int)lVar15 != (int)sVar7) {
                    pcVar16 = "Read Error in \'%s\'\n";
                    pFVar10 = (FILE *)local_3f78[0].dir[local_3fb0].fname;
                    goto LAB_0010269c;
                  }
                  sVar19 = (size_t)(int)sVar7;
                  sVar7 = write(iVar4,local_2039 + 1,sVar19);
                  if (sVar7 != sVar19) {
                    pcVar16 = "Write Error in \'%s\'\n";
                    pFVar10 = (FILE *)local_3f78[0].dir[local_3fb0].fname;
                    goto LAB_0010269c;
                  }
                  lVar17 = lVar17 + sVar19;
                  lVar15 = local_3f78[0].dir[local_3fb0].fsize;
                } while (lVar17 != lVar15);
                close(iVar4);
                argc = (uint)local_3fa8;
                if (local_3fb4 != 0) {
                  printf("x %s\n",local_3f78[0].dir[local_3fb0].fname);
                }
              }
            }
            else {
              uVar14 = unaff_EBP;
              if ((int)unaff_EBP < argc) {
                pcVar16 = local_3f78[0].dir[local_3fb0].fname;
                lVar15 = 0;
                do {
                  iVar4 = strcmp(pcVar16,argv[unaff_R12 + lVar15]);
                  if (iVar4 == 0) {
                    uVar14 = (int)lVar15 + unaff_EBP;
                    goto LAB_0010257d;
                  }
                  lVar15 = lVar15 + 1;
                } while (uVar22 - unaff_R12 != lVar15);
              }
              else {
LAB_0010257d:
                plVar18 = local_3f78[0].dir;
                if (uVar14 != argc) goto LAB_0010258b;
              }
            }
            local_3fb0 = local_3fb0 + 1;
          } while (local_3fb0 < local_3f78[0].nentries);
        }
LAB_001027ec:
        close_library(local_3f78);
        goto LAB_001027f6;
      }
      pcVar16 = "Internal error - action.";
    }
LAB_0010246d:
    puts(pcVar16);
  }
LAB_001026a3:
  exit(1);
LAB_001028a0:
  printf("Too many dlb files!  Stopping at %d.\n",0xfa);
  goto LAB_001026a3;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, r;
    int ap=2;				/* argument pointer */
    int cp;				/* command pointer */
    int iseen=0, fseen=0, verbose=0;	/* flags */
    char action=' ';
    library lib;

    if (argc > 0 && argv[0] && *argv[0]) progname = argv[0];

    if (argc<2) {
	usage();
	/* doesn't return */
    }

    for (cp=0; argv[1][cp]; cp++){
	switch(argv[1][cp]){
	    default:
		usage();	/* doesn't return */
	    case '-':	/* silently ignore */
		break;
	    case '?':
	    case 'h':
		verbose_help();
		break;
	    case 'I':
		if (ap == argc) usage();
		list_file=argv[ap++];
		if (iseen)
		    printf("Warning: multiple I options.  Previous ignored.\n");
		iseen=1;
		break;
	    case 'f':
		if (ap == argc) usage();
		library_file=argv[ap++];
		if (fseen)
		    printf("Warning: multiple f options.  Previous ignored.\n");
		fseen=1;
		break;
	    case 'C':
		if (ap == argc) usage();
		if (chdir(argv[ap++])){
		    printf("Can't chdir to %s\n",argv[--ap]);
		    xexit(EXIT_FAILURE);
		}
		break;
	    case 'v':
		verbose=1;
		break;
	    case 't':
	    case 'c':
	    case 'x':
		if (action != ' '){
		    printf("Only one of t,x,c may be specified.\n");
		    usage();
		}
		action=argv[1][cp];
		break;
	}
    }

    if (argv[ap] && iseen){
	printf("Too many arguments.\n");
	xexit(EXIT_FAILURE);
    }

    switch(action){
    default:
	printf("Internal error - action.\n");
	xexit(EXIT_FAILURE);
	break;
    case 't':			/* list archive */
	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (verbose)
		printf("%-14s %6ld %6ld\n",
		    lib.dir[i].fname, lib.dir[i].foffset, lib.dir[i].fsize);
	    else
		printf("%s\n", lib.dir[i].fname);
	}

	if (verbose)
	    printf("Revision:%ld  File count:%ld  String size:%ld\n",
		lib.rev, lib.nentries, lib.strsize);

	close_library(&lib);
	xexit(EXIT_SUCCESS);

    case 'x': {			/* extract archive contents */
	int f, n;
	long remainder, total_read;
	char buf[BUFSIZ];

	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (argv[ap]) {
		/* if files are listed, see if current is wanted */
		int c;
		for (c = ap; c < argc; c++)
		    if (!FILENAME_CMP(lib.dir[i].fname, argv[c])) break;
		if (c == argc) continue;	/* skip */
	    } else if (!FILENAME_CMP(lib.dir[i].fname, DLB_DIRECTORY)) {
		/*
		 * Don't extract the directory unless the user
		 * specifically asks for it.
		 *
		 * Perhaps we should never extract the directory???
		 */
		continue;
	    }
	    fseek(lib.fdata, lib.dir[i].foffset, SEEK_SET);

	    f = open(lib.dir[i].fname, O_WRONLY|O_TRUNC|O_BINARY|O_CREAT, 0640);
	    if (f < 0) {
		printf("Can't create '%s'\n", lib.dir[i].fname);
		xexit(EXIT_FAILURE);
	    }

	    /* read chunks from library and write them out */
	    total_read = 0;
	    do {
		remainder = lib.dir[i].fsize - total_read;
		if (remainder > (long) sizeof(buf))
		    r = (int) sizeof(buf);
		else
		    r = remainder;

		n = fread(buf, 1, r, lib.fdata);
		if (n != r) {
		    printf("Read Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(f, buf, n) != n) {
		    printf("Write Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}

		total_read += n;
	    } while (total_read != lib.dir[i].fsize);

	    close(f);

	    if (verbose) printf("x %s\n", lib.dir[i].fname);
	}

	close_library(&lib);
	xexit(EXIT_SUCCESS);
	}

    case 'c':			/* create archive */
	{
	libdir ld[MAX_DLB_FILES];
	char buf[BUFSIZ];
	int fd, out, nfiles = 0;
	long dir_size, slen, flen, fsiz;
	boolean rewrite_directory = FALSE;

	/*
	 * Get names from either/both an argv list and a file
	 * list.  This does not do any duplicate checking
	 */

	/* get file name in argv list */
	if (argv[ap]) {
	    for ( ; ap < argc; ap++, nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		ld[nfiles].fname = malloc(strlen(argv[ap]) + 1);
		strcpy(ld[nfiles].fname, argv[ap]);
	    }
	}

	if (iseen) {
	    /* want to do a list file */
	    FILE *list = fopen(list_file, "r");
	    if (!list) {
		printf("Can't open %s\n",list_file);
		xexit(EXIT_FAILURE);
	    }

	    /* get file names, one per line */
	    for ( ; fgets(buf, sizeof(buf), list); nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		*(eos(buf)-1) = '\0';	/* strip newline */
		ld[nfiles].fname = malloc(strlen(buf) + 1);
		strcpy(ld[nfiles].fname, buf);
	    }
	    fclose(list);
	}

	if (nfiles == 0) {
	    printf("No files to archive\n");
	    xexit(EXIT_FAILURE);
	}


	/*
	 * Get file sizes and name string length.  Don't include
	 * the directory information yet.
	 */
	for (i = 0, slen = 0, flen = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open %s\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    ld[i].fsize = lseek(fd, 0, SEEK_END);
	    ld[i].foffset = flen;

	    slen += strlen(ld[i].fname);	/* don't add null (yet) */
	    flen += ld[i].fsize;
	    close(fd);
	}

	/* open output file */
	out = open(library_file, O_RDWR|O_TRUNC|O_BINARY|O_CREAT, FCMASK);
	if (out < 0) {
	    printf("Can't open %s for output\n", library_file);
	    xexit(EXIT_FAILURE);
	}

	/* caculate directory size */
	dir_size = 40			/* header line (see below) */
		   + ((nfiles+1)*11)	/* handling+file offset+SP+newline */
		   + slen+strlen(DLB_DIRECTORY); /* file names */

	/* write directory */
	write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);

	flen = 0L;
	/* write each file */
	for (i = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open input file '%s'\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    if (verbose) printf("%s\n",ld[i].fname);

	    fsiz = 0L;
	    while ((r = read(fd, buf, sizeof buf)) != 0) {
		if (r == -1) {
		    printf("Read Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(out, buf, r) != r) {
		    printf("Write Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		fsiz += r;
	    }
	    close(fd);
	    if (fsiz != ld[i].fsize) rewrite_directory = TRUE;
	    /* in case directory rewrite is needed */
	    ld[i].fsize = fsiz;
	    ld[i].foffset = flen;
	    flen += fsiz;
	}

	if (rewrite_directory) {
	    if (verbose) printf("(rewriting dlb directory info)\n");
	    lseek(out, 0, SEEK_SET);	/* rewind */
	    write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);
	}

	for (i = 0; i < nfiles; i++)
	    free(ld[i].fname),  ld[i].fname = 0;

	close(out);
	xexit(EXIT_SUCCESS);
	}
    }

    xexit(EXIT_SUCCESS);
    /*NOTREACHED*/
    return 0;
}